

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

bool __thiscall
fasttext::FastText::predictLine
          (FastText *this,istream *in,
          vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *predictions,int32_t k,real threshold)

{
  pointer ppVar1;
  int iVar2;
  pointer ppVar3;
  float fVar4;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> linePredictions;
  vector<int,_std::allocator<int>_> words;
  vector<int,_std::allocator<int>_> labels;
  string local_d8;
  vector<std::pair<float,std::__cxx11::string>,std::allocator<std::pair<float,std::__cxx11::string>>>
  *local_b8;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> local_88;
  _Vector_base<int,_std::allocator<int>_> local_68;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_b8 = (vector<std::pair<float,std::__cxx11::string>,std::allocator<std::pair<float,std::__cxx11::string>>>
              *)predictions;
  std::
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(predictions);
  iVar2 = std::istream::peek();
  if (iVar2 != -1) {
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Dictionary::getLine((this->dict_).
                        super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        in,(vector<int,_std::allocator<int>_> *)&local_68,
                        (vector<int,_std::allocator<int>_> *)&local_48);
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    predict(this,k,(vector<int,_std::allocator<int>_> *)&local_68,
            (vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)&local_88,
            threshold);
    ppVar1 = local_88._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar3 = local_88._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1;
        ppVar3 = ppVar3 + 1) {
      fVar4 = expf(ppVar3->first);
      Dictionary::getLabel_abi_cxx11_
                (&local_d8,
                 (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,ppVar3->second);
      local_a0 = local_d8._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
        local_98._8_8_ = local_d8.field_2._8_8_;
        local_a8._M_p = (pointer)&local_98;
      }
      else {
        local_a8._M_p = local_d8._M_dataplus._M_p;
      }
      local_98._M_allocated_capacity._1_7_ = local_d8.field_2._M_allocated_capacity._1_7_;
      local_98._M_local_buf[0] = local_d8.field_2._M_local_buf[0];
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      local_b0._0_4_ = fVar4;
      std::
      vector<std::pair<float,std::__cxx11::string>,std::allocator<std::pair<float,std::__cxx11::string>>>
      ::emplace_back<std::pair<float,std::__cxx11::string>>
                (local_b8,(pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_b0);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    std::_Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::~_Vector_base
              (&local_88);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  }
  return iVar2 != -1;
}

Assistant:

bool FastText::predictLine(
		std::istream& in,
		std::vector<std::pair<real, std::string>>& predictions,
		int32_t k,
		real threshold) const {
	predictions.clear();
	if (in.peek() == EOF) {
		return false;
	}

	std::vector<int32_t> words, labels;
	dict_->getLine(in, words, labels);
	std::vector<std::pair<real, int32_t>> linePredictions;
	predict(k, words, linePredictions, threshold);
	for (const auto& p : linePredictions) {
		predictions.push_back(
				std::make_pair(std::exp(p.first), dict_->getLabel(p.second)));
	}

	return true;
}